

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::ZIVTest
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair)

{
  type *ppSVar1;
  type *ppSVar2;
  bool bVar3;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  type local_30;
  type destination;
  type source;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair_local;
  LoopDependenceAnalysis *this_local;
  
  source = (type)subscript_pair;
  subscript_pair_local = (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)this;
  ppSVar1 = std::get<0ul,spvtools::opt::SENode*,spvtools::opt::SENode*>(subscript_pair);
  destination = *ppSVar1;
  ppSVar2 = std::get<1ul,spvtools::opt::SENode*,spvtools::opt::SENode*>
                      ((pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)source);
  local_30 = *ppSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Performing ZIVTest",&local_51);
  PrintDebug(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar3 = destination != local_30;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"ZIVTest found independence.",&local_a1);
    PrintDebug(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"ZIVTest found EQ dependence.",&local_79);
    PrintDebug(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return bVar3;
}

Assistant:

bool LoopDependenceAnalysis::ZIVTest(
    const std::pair<SENode*, SENode*>& subscript_pair) {
  auto source = std::get<0>(subscript_pair);
  auto destination = std::get<1>(subscript_pair);

  PrintDebug("Performing ZIVTest");
  // If source == destination, dependence with direction = and distance 0.
  if (source == destination) {
    PrintDebug("ZIVTest found EQ dependence.");
    return false;
  } else {
    PrintDebug("ZIVTest found independence.");
    // Otherwise we prove independence.
    return true;
  }
}